

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::internal::
MatcherBase<const_std::tuple<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&>_&>
::~MatcherBase(MatcherBase<const_std::tuple<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&>_&>
               *this)

{
  MatcherBase<const_std::tuple<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&>_&>
  *this_local;
  
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }